

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

SP __thiscall pbrt::BinaryReader::createEntity(BinaryReader *this,int typeTag)

{
  SpotLightSource *__p;
  ostream *poVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_31;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_33;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_34;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_35;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_36;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_37;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_39;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_41;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_42;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_43;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_44;
  SP SVar4;
  vec2i local_50;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  undefined1 local_29;
  
  switch(in_EDX) {
  case 1:
    std::__shared_ptr<pbrt::Scene,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Scene>>
              ((__shared_ptr<pbrt::Scene,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::Scene> *)&local_50);
    _Var3._M_pi = extraout_RDX;
    goto LAB_00158fca;
  case 2:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::Object,std::allocator<pbrt::Object>>
              (a_Stack_40,(Object **)&local_48,(allocator<pbrt::Object> *)&local_50);
    std::__shared_ptr<pbrt::Object,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::Object,pbrt::Object>
              ((__shared_ptr<pbrt::Object,(__gnu_cxx::_Lock_policy)2> *)&local_48,(Object *)local_48
              );
    _Var3._M_pi = extraout_RDX_18;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"unknown entity type tag ",0x18);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,in_EDX);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," in binary file",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    local_48._0_4_ = 0;
    local_48._4_4_ = 0;
    a_Stack_40[0]._M_pi._0_4_ = 0;
    a_Stack_40[0]._M_pi._4_4_ = 0;
    _Var3._M_pi = extraout_RDX_27;
    goto LAB_0015900f;
  case 4:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::Instance,std::allocator<pbrt::Instance>>
              (a_Stack_40,(Instance **)&local_48,(allocator<pbrt::Instance> *)&local_50);
    std::__shared_ptr<pbrt::Instance,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::Instance,pbrt::Instance>
              ((__shared_ptr<pbrt::Instance,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (Instance *)local_48);
    _Var3._M_pi = extraout_RDX_29;
    break;
  case 5:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::Camera,std::allocator<pbrt::Camera>>
              (a_Stack_40,(Camera **)&local_48,(allocator<pbrt::Camera> *)&local_50);
    std::__shared_ptr<pbrt::Camera,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::Camera,pbrt::Camera>
              ((__shared_ptr<pbrt::Camera,(__gnu_cxx::_Lock_policy)2> *)&local_48,(Camera *)local_48
              );
    _Var3._M_pi = extraout_RDX_17;
    break;
  case 6:
    local_50.x = 0;
    local_50.y = 0;
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::Film,std::allocator<pbrt::Film>,pbrt::math::vec2i>
              (a_Stack_40,(Film **)&local_48,(allocator<pbrt::Film> *)&local_29,&local_50);
    std::__shared_ptr<pbrt::Film,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::Film,pbrt::Film>
              ((__shared_ptr<pbrt::Film,(__gnu_cxx::_Lock_policy)2> *)&local_48,(Film *)local_48);
    _Var3._M_pi = extraout_RDX_24;
    break;
  case 7:
    std::__shared_ptr<pbrt::Spectrum,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Spectrum>>
              ((__shared_ptr<pbrt::Spectrum,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::Spectrum> *)&local_50);
    _Var3._M_pi = extraout_RDX_28;
    goto LAB_00158fca;
  case 8:
    std::__shared_ptr<pbrt::Sampler,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Sampler>>
              ((__shared_ptr<pbrt::Sampler,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::Sampler> *)&local_50);
    _Var3._M_pi = extraout_RDX_35;
    goto LAB_00158fca;
  case 9:
    std::__shared_ptr<pbrt::Integrator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Integrator>>
              ((__shared_ptr<pbrt::Integrator,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::Integrator> *)&local_50);
    _Var3._M_pi = extraout_RDX_36;
    goto LAB_00158fca;
  case 10:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::Material,std::allocator<pbrt::Material>>
              (a_Stack_40,(Material **)&local_48,(allocator<pbrt::Material> *)&local_50);
    std::__shared_ptr<pbrt::Material,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::Material,pbrt::Material>
              ((__shared_ptr<pbrt::Material,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               &local_48->super_Material);
    _Var3._M_pi = extraout_RDX_12;
    break;
  case 0xb:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::DisneyMaterial,std::allocator<pbrt::DisneyMaterial>>
              (a_Stack_40,(DisneyMaterial **)&local_48,(allocator<pbrt::DisneyMaterial> *)&local_50)
    ;
    std::__shared_ptr<pbrt::DisneyMaterial,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::DisneyMaterial,pbrt::DisneyMaterial>
              ((__shared_ptr<pbrt::DisneyMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (DisneyMaterial *)local_48);
    _Var3._M_pi = extraout_RDX_37;
    break;
  case 0xc:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::UberMaterial,std::allocator<pbrt::UberMaterial>>
              (a_Stack_40,(UberMaterial **)&local_48,(allocator<pbrt::UberMaterial> *)&local_50);
    std::__shared_ptr<pbrt::UberMaterial,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::UberMaterial,pbrt::UberMaterial>
              ((__shared_ptr<pbrt::UberMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_48,local_48);
    _Var3._M_pi = extraout_RDX_15;
    break;
  case 0xd:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::MixMaterial,std::allocator<pbrt::MixMaterial>>
              (a_Stack_40,(MixMaterial **)&local_48,(allocator<pbrt::MixMaterial> *)&local_50);
    std::__shared_ptr<pbrt::MixMaterial,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::MixMaterial,pbrt::MixMaterial>
              ((__shared_ptr<pbrt::MixMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (MixMaterial *)local_48);
    _Var3._M_pi = extraout_RDX_25;
    break;
  case 0xe:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::GlassMaterial,std::allocator<pbrt::GlassMaterial>>
              (a_Stack_40,(GlassMaterial **)&local_48,(allocator<pbrt::GlassMaterial> *)&local_50);
    std::__shared_ptr<pbrt::GlassMaterial,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::GlassMaterial,pbrt::GlassMaterial>
              ((__shared_ptr<pbrt::GlassMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (GlassMaterial *)local_48);
    _Var3._M_pi = extraout_RDX_22;
    break;
  case 0xf:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::MirrorMaterial,std::allocator<pbrt::MirrorMaterial>>
              (a_Stack_40,(MirrorMaterial **)&local_48,(allocator<pbrt::MirrorMaterial> *)&local_50)
    ;
    std::__shared_ptr<pbrt::MirrorMaterial,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::MirrorMaterial,pbrt::MirrorMaterial>
              ((__shared_ptr<pbrt::MirrorMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (MirrorMaterial *)local_48);
    _Var3._M_pi = extraout_RDX_10;
    break;
  case 0x10:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::MatteMaterial,std::allocator<pbrt::MatteMaterial>>
              (a_Stack_40,(MatteMaterial **)&local_48,(allocator<pbrt::MatteMaterial> *)&local_50);
    std::__shared_ptr<pbrt::MatteMaterial,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::MatteMaterial,pbrt::MatteMaterial>
              ((__shared_ptr<pbrt::MatteMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (MatteMaterial *)local_48);
    _Var3._M_pi = extraout_RDX_33;
    break;
  case 0x11:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::SubstrateMaterial,std::allocator<pbrt::SubstrateMaterial>>
              (a_Stack_40,(SubstrateMaterial **)&local_48,
               (allocator<pbrt::SubstrateMaterial> *)&local_50);
    std::__shared_ptr<pbrt::SubstrateMaterial,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::SubstrateMaterial,pbrt::SubstrateMaterial>
              ((__shared_ptr<pbrt::SubstrateMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (SubstrateMaterial *)local_48);
    _Var3._M_pi = extraout_RDX_34;
    break;
  case 0x12:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::SubSurfaceMaterial,std::allocator<pbrt::SubSurfaceMaterial>>
              (a_Stack_40,(SubSurfaceMaterial **)&local_48,
               (allocator<pbrt::SubSurfaceMaterial> *)&local_50);
    std::__shared_ptr<pbrt::SubSurfaceMaterial,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::SubSurfaceMaterial,pbrt::SubSurfaceMaterial>
              ((__shared_ptr<pbrt::SubSurfaceMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (SubSurfaceMaterial *)local_48);
    _Var3._M_pi = extraout_RDX_40;
    break;
  case 0x13:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::FourierMaterial,std::allocator<pbrt::FourierMaterial>>
              (a_Stack_40,(FourierMaterial **)&local_48,
               (allocator<pbrt::FourierMaterial> *)&local_50);
    std::__shared_ptr<pbrt::FourierMaterial,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::FourierMaterial,pbrt::FourierMaterial>
              ((__shared_ptr<pbrt::FourierMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (FourierMaterial *)local_48);
    _Var3._M_pi = extraout_RDX_39;
    break;
  case 0x14:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::MetalMaterial,std::allocator<pbrt::MetalMaterial>>
              (a_Stack_40,(MetalMaterial **)&local_48,(allocator<pbrt::MetalMaterial> *)&local_50);
    std::__shared_ptr<pbrt::MetalMaterial,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::MetalMaterial,pbrt::MetalMaterial>
              ((__shared_ptr<pbrt::MetalMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (MetalMaterial *)local_48);
    _Var3._M_pi = extraout_RDX_07;
    break;
  case 0x15:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::PlasticMaterial,std::allocator<pbrt::PlasticMaterial>>
              (a_Stack_40,(PlasticMaterial **)&local_48,
               (allocator<pbrt::PlasticMaterial> *)&local_50);
    std::__shared_ptr<pbrt::PlasticMaterial,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::PlasticMaterial,pbrt::PlasticMaterial>
              ((__shared_ptr<pbrt::PlasticMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (PlasticMaterial *)local_48);
    _Var3._M_pi = extraout_RDX_23;
    break;
  case 0x16:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::TranslucentMaterial,std::allocator<pbrt::TranslucentMaterial>>
              (a_Stack_40,(TranslucentMaterial **)&local_48,
               (allocator<pbrt::TranslucentMaterial> *)&local_50);
    std::__shared_ptr<pbrt::TranslucentMaterial,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::TranslucentMaterial,pbrt::TranslucentMaterial>
              ((__shared_ptr<pbrt::TranslucentMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (TranslucentMaterial *)local_48);
    _Var3._M_pi = extraout_RDX_42;
    break;
  case 0x17:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::HairMaterial,std::allocator<pbrt::HairMaterial>>
              (a_Stack_40,(HairMaterial **)&local_48,(allocator<pbrt::HairMaterial> *)&local_50);
    std::__shared_ptr<pbrt::HairMaterial,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::HairMaterial,pbrt::HairMaterial>
              ((__shared_ptr<pbrt::HairMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (HairMaterial *)local_48);
    _Var3._M_pi = extraout_RDX_09;
    break;
  case 0x1e:
    std::__shared_ptr<pbrt::Texture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Texture>>
              ((__shared_ptr<pbrt::Texture,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::Texture> *)&local_50);
    _Var3._M_pi = extraout_RDX_21;
    goto LAB_00158fca;
  case 0x1f:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::ImageTexture,std::allocator<pbrt::ImageTexture>>
              (a_Stack_40,(ImageTexture **)&local_48,(allocator<pbrt::ImageTexture> *)&local_50);
    std::__shared_ptr<pbrt::ImageTexture,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::ImageTexture,pbrt::ImageTexture>
              ((__shared_ptr<pbrt::ImageTexture,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (ImageTexture *)local_48);
    _Var3._M_pi = extraout_RDX_13;
    break;
  case 0x20:
    std::__shared_ptr<pbrt::ScaleTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::ScaleTexture>>
              ((__shared_ptr<pbrt::ScaleTexture,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::ScaleTexture> *)&local_50);
    _Var3._M_pi = extraout_RDX_30;
    goto LAB_00158fca;
  case 0x21:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::PtexFileTexture,std::allocator<pbrt::PtexFileTexture>>
              (a_Stack_40,(PtexFileTexture **)&local_48,
               (allocator<pbrt::PtexFileTexture> *)&local_50);
    std::__shared_ptr<pbrt::PtexFileTexture,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::PtexFileTexture,pbrt::PtexFileTexture>
              ((__shared_ptr<pbrt::PtexFileTexture,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (PtexFileTexture *)local_48);
    _Var3._M_pi = extraout_RDX_11;
    break;
  case 0x22:
    std::__shared_ptr<pbrt::ConstantTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::ConstantTexture>>
              ((__shared_ptr<pbrt::ConstantTexture,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::ConstantTexture> *)&local_50);
    _Var3._M_pi = extraout_RDX_05;
    goto LAB_00158fca;
  case 0x23:
    std::__shared_ptr<pbrt::CheckerTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::CheckerTexture>>
              ((__shared_ptr<pbrt::CheckerTexture,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::CheckerTexture> *)&local_50);
    _Var3._M_pi = extraout_RDX_43;
    goto LAB_00158fca;
  case 0x24:
    std::__shared_ptr<pbrt::WindyTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::WindyTexture>>
              ((__shared_ptr<pbrt::WindyTexture,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::WindyTexture> *)&local_50);
    _Var3._M_pi = extraout_RDX_16;
    goto LAB_00158fca;
  case 0x25:
    std::__shared_ptr<pbrt::FbmTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::FbmTexture>>
              ((__shared_ptr<pbrt::FbmTexture,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::FbmTexture> *)&local_50);
    _Var3._M_pi = extraout_RDX_19;
    goto LAB_00158fca;
  case 0x26:
    std::__shared_ptr<pbrt::MarbleTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::MarbleTexture>>
              ((__shared_ptr<pbrt::MarbleTexture,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::MarbleTexture> *)&local_50);
    _Var3._M_pi = extraout_RDX_32;
    goto LAB_00158fca;
  case 0x27:
    local_48 = (UberMaterial *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
    (a_Stack_40[0]._M_pi)->_M_use_count = 1;
    (a_Stack_40[0]._M_pi)->_M_weak_count = 1;
    (a_Stack_40[0]._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_0017b3b8;
    local_48 = (UberMaterial *)(a_Stack_40[0]._M_pi + 1);
    a_Stack_40[0]._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[1]._M_use_count = 0;
    a_Stack_40[0]._M_pi[1]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[2]._M_use_count = 0;
    a_Stack_40[0]._M_pi[2]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[3]._M_use_count = 0;
    a_Stack_40[0]._M_pi[3]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[4]._M_use_count = 0;
    a_Stack_40[0]._M_pi[4]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[5]._M_use_count = 0;
    a_Stack_40[0]._M_pi[5]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[6]._M_use_count = 0;
    a_Stack_40[0]._M_pi[6]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[7]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[7]._M_use_count = 0;
    a_Stack_40[0]._M_pi[7]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR_toString_abi_cxx11__0017c7d8;
    a_Stack_40[0]._M_pi[2]._M_use_count = 0x3f800000;
    a_Stack_40[0]._M_pi[2]._M_weak_count = 0x3f800000;
    *(undefined4 *)&a_Stack_40[0]._M_pi[3]._vptr__Sp_counted_base = 0x3f800000;
    a_Stack_40[0]._M_pi[3]._M_use_count = 0;
    a_Stack_40[0]._M_pi[3]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[4]._M_use_count = 0;
    a_Stack_40[0]._M_pi[4]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[5]._M_use_count = 0;
    a_Stack_40[0]._M_pi[5]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[6]._M_use_count = 0x3f800000;
    a_Stack_40[0]._M_pi[6]._M_weak_count = 0x3f800000;
    a_Stack_40[0]._M_pi[7]._vptr__Sp_counted_base = (_func_int **)0x3f8000003f800000;
    a_Stack_40[0]._M_pi[7]._M_use_count = 0x3f800000;
    a_Stack_40[0]._M_pi[7]._M_weak_count = 0x3f800000;
    std::__shared_ptr<pbrt::MixTexture,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::MixTexture,pbrt::MixTexture>
              ((__shared_ptr<pbrt::MixTexture,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (MixTexture *)local_48);
    _Var3._M_pi = extraout_RDX_20;
    break;
  case 0x28:
    std::__shared_ptr<pbrt::WrinkledTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::WrinkledTexture>>
              ((__shared_ptr<pbrt::WrinkledTexture,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::WrinkledTexture> *)&local_50);
    _Var3._M_pi = extraout_RDX_01;
    goto LAB_00158fca;
  case 0x32:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::TriangleMesh,std::allocator<pbrt::TriangleMesh>>
              (a_Stack_40,(TriangleMesh **)&local_48,(allocator<pbrt::TriangleMesh> *)&local_50);
    std::__shared_ptr<pbrt::TriangleMesh,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::TriangleMesh,pbrt::TriangleMesh>
              ((__shared_ptr<pbrt::TriangleMesh,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (TriangleMesh *)local_48);
    _Var3._M_pi = extraout_RDX_08;
    break;
  case 0x33:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::QuadMesh,std::allocator<pbrt::QuadMesh>>
              (a_Stack_40,(QuadMesh **)&local_48,(allocator<pbrt::QuadMesh> *)&local_50);
    std::__shared_ptr<pbrt::QuadMesh,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::QuadMesh,pbrt::QuadMesh>
              ((__shared_ptr<pbrt::QuadMesh,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (QuadMesh *)local_48);
    _Var3._M_pi = extraout_RDX_38;
    break;
  case 0x34:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::Sphere,std::allocator<pbrt::Sphere>>
              (a_Stack_40,(Sphere **)&local_48,(allocator<pbrt::Sphere> *)&local_50);
    std::__shared_ptr<pbrt::Sphere,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::Sphere,pbrt::Sphere>
              ((__shared_ptr<pbrt::Sphere,(__gnu_cxx::_Lock_policy)2> *)&local_48,(Sphere *)local_48
              );
    _Var3._M_pi = extraout_RDX_44;
    break;
  case 0x35:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::Disk,std::allocator<pbrt::Disk>>
              (a_Stack_40,(Disk **)&local_48,(allocator<pbrt::Disk> *)&local_50);
    std::__shared_ptr<pbrt::Disk,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::Disk,pbrt::Disk>
              ((__shared_ptr<pbrt::Disk,(__gnu_cxx::_Lock_policy)2> *)&local_48,(Disk *)local_48);
    _Var3._M_pi = extraout_RDX_04;
    break;
  case 0x36:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::Curve,std::allocator<pbrt::Curve>>
              (a_Stack_40,(Curve **)&local_48,(allocator<pbrt::Curve> *)&local_50);
    std::__shared_ptr<pbrt::Curve,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::Curve,pbrt::Curve>
              ((__shared_ptr<pbrt::Curve,(__gnu_cxx::_Lock_policy)2> *)&local_48,(Curve *)local_48);
    _Var3._M_pi = extraout_RDX_31;
    break;
  case 0x3c:
    std::__shared_ptr<pbrt::DiffuseAreaLightBB,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::DiffuseAreaLightBB>>
              ((__shared_ptr<pbrt::DiffuseAreaLightBB,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::DiffuseAreaLightBB> *)&local_50);
    _Var3._M_pi = extraout_RDX_03;
    goto LAB_00158fca;
  case 0x3d:
    std::__shared_ptr<pbrt::DiffuseAreaLightRGB,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::DiffuseAreaLightRGB>>
              ((__shared_ptr<pbrt::DiffuseAreaLightRGB,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::DiffuseAreaLightRGB> *)&local_50);
    _Var3._M_pi = extraout_RDX_02;
    goto LAB_00158fca;
  case 0x46:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::InfiniteLightSource,std::allocator<pbrt::InfiniteLightSource>>
              (a_Stack_40,(InfiniteLightSource **)&local_48,
               (allocator<pbrt::InfiniteLightSource> *)&local_50);
    std::__shared_ptr<pbrt::InfiniteLightSource,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::InfiniteLightSource,pbrt::InfiniteLightSource>
              ((__shared_ptr<pbrt::InfiniteLightSource,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (InfiniteLightSource *)local_48);
    _Var3._M_pi = extraout_RDX_14;
    break;
  case 0x47:
    local_48 = (UberMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::DistantLightSource,std::allocator<pbrt::DistantLightSource>>
              (a_Stack_40,(DistantLightSource **)&local_48,
               (allocator<pbrt::DistantLightSource> *)&local_50);
    std::__shared_ptr<pbrt::DistantLightSource,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::DistantLightSource,pbrt::DistantLightSource>
              ((__shared_ptr<pbrt::DistantLightSource,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (DistantLightSource *)local_48);
    _Var3._M_pi = extraout_RDX_26;
    break;
  case 0x48:
    local_48 = (UberMaterial *)0x0;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x98);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017bb38;
    __p = (SpotLightSource *)(p_Var2 + 1);
    memset(__p,0,0x88);
    p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR_toString_abi_cxx11__0017c5d8;
    p_Var2[4]._vptr__Sp_counted_base = (_func_int **)0x3f8000003f800000;
    p_Var2[4]._M_use_count = 0x3f800000;
    p_Var2[5]._M_use_count = 0;
    p_Var2[5]._M_weak_count = 0;
    p_Var2[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[5]._vptr__Sp_counted_base = (_func_int **)&PTR_toString_abi_cxx11__0017be18;
    p_Var2[6]._M_use_count = 0;
    p_Var2[6]._M_weak_count = 0;
    p_Var2[7]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[7]._M_use_count = 0;
    p_Var2[7]._M_weak_count = 0;
    p_Var2[8]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[8]._M_use_count = 0x3f800000;
    p_Var2[8]._M_weak_count = 0x3f800000;
    *(undefined4 *)&p_Var2[9]._vptr__Sp_counted_base = 0x3f800000;
    local_48 = (UberMaterial *)__p;
    a_Stack_40[0]._M_pi = p_Var2;
    std::__shared_ptr<pbrt::SpotLightSource,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::SpotLightSource,pbrt::SpotLightSource>
              ((__shared_ptr<pbrt::SpotLightSource,(__gnu_cxx::_Lock_policy)2> *)&local_48,__p);
    (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    _Var3._M_pi = extraout_RDX_41;
    goto LAB_0015900f;
  case 0x49:
    local_48 = (UberMaterial *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
    (a_Stack_40[0]._M_pi)->_M_use_count = 1;
    (a_Stack_40[0]._M_pi)->_M_weak_count = 1;
    (a_Stack_40[0]._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_0017bae8;
    local_48 = (UberMaterial *)(a_Stack_40[0]._M_pi + 1);
    a_Stack_40[0]._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[1]._M_use_count = 0;
    a_Stack_40[0]._M_pi[1]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[3]._M_use_count = 0;
    a_Stack_40[0]._M_pi[3]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[4]._M_use_count = 0;
    a_Stack_40[0]._M_pi[4]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[5]._M_use_count = 0;
    a_Stack_40[0]._M_pi[5]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[6]._M_use_count = 0;
    a_Stack_40[0]._M_pi[6]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[7]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[7]._M_use_count = 0;
    a_Stack_40[0]._M_pi[7]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[2]._M_use_count = 0;
    a_Stack_40[0]._M_pi[2]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR_toString_abi_cxx11__0017c618;
    *(undefined8 *)((long)&a_Stack_40[0]._M_pi[3]._vptr__Sp_counted_base + 4) = 0x3f8000003f800000;
    a_Stack_40[0]._M_pi[3]._M_weak_count = 0x3f800000;
    a_Stack_40[0]._M_pi[4]._M_use_count = 0;
    a_Stack_40[0]._M_pi[4]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[4]._vptr__Sp_counted_base = (_func_int **)&PTR_toString_abi_cxx11__0017be18;
    a_Stack_40[0]._M_pi[5]._M_use_count = 0;
    a_Stack_40[0]._M_pi[5]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    a_Stack_40[0]._M_pi[6]._M_use_count = 0;
    a_Stack_40[0]._M_pi[6]._M_weak_count = 0;
    a_Stack_40[0]._M_pi[7]._vptr__Sp_counted_base = (_func_int **)0x3f8000003f800000;
    a_Stack_40[0]._M_pi[7]._M_use_count = 0x3f800000;
    std::__shared_ptr<pbrt::PointLightSource,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::PointLightSource,pbrt::PointLightSource>
              ((__shared_ptr<pbrt::PointLightSource,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (PointLightSource *)local_48);
    _Var3._M_pi = extraout_RDX_00;
    break;
  case 0x50:
    std::__shared_ptr<pbrt::PixelFilter,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::PixelFilter>>
              ((__shared_ptr<pbrt::PixelFilter,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (allocator<pbrt::PixelFilter> *)&local_50);
    _Var3._M_pi = extraout_RDX_06;
LAB_00158fca:
    (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    goto LAB_0015900f;
  }
  (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_0015900f:
  *(undefined4 *)
   &(this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (undefined4)local_48;
  *(undefined4 *)
   ((long)&(this->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = local_48._4_4_;
  *(undefined4 *)
   &(this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = a_Stack_40[0]._M_pi._0_4_;
  *(undefined4 *)
   ((long)&(this->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = a_Stack_40[0]._M_pi._4_4_;
  SVar4.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  SVar4.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar4.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Entity::SP createEntity(int typeTag)
    {
      switch (typeTag) {
      case TYPE_SCENE:
        return std::make_shared<Scene>();
      case TYPE_TEXTURE:
        return std::make_shared<Texture>();
      case TYPE_IMAGE_TEXTURE:
        return std::make_shared<ImageTexture>();
      case TYPE_SCALE_TEXTURE:
        return std::make_shared<ScaleTexture>();
      case TYPE_PTEX_FILE_TEXTURE:
        return std::make_shared<PtexFileTexture>();
      case TYPE_CONSTANT_TEXTURE:
        return std::make_shared<ConstantTexture>();
      case TYPE_CHECKER_TEXTURE:
        return std::make_shared<CheckerTexture>();
      case TYPE_WINDY_TEXTURE:
        return std::make_shared<WindyTexture>();
      case TYPE_FBM_TEXTURE:
        return std::make_shared<FbmTexture>();
      case TYPE_MARBLE_TEXTURE:
        return std::make_shared<MarbleTexture>();
      case TYPE_MIX_TEXTURE:
        return std::make_shared<MixTexture>();
      case TYPE_WRINKLED_TEXTURE:
        return std::make_shared<WrinkledTexture>();
      case TYPE_MATERIAL:
        return std::make_shared<Material>();
      case TYPE_DISNEY_MATERIAL:
        return std::make_shared<DisneyMaterial>();
      case TYPE_UBER_MATERIAL:
        return std::make_shared<UberMaterial>();
      case TYPE_MIX_MATERIAL:
        return std::make_shared<MixMaterial>();
      case TYPE_TRANSLUCENT_MATERIAL:
        return std::make_shared<TranslucentMaterial>();
      case TYPE_GLASS_MATERIAL:
        return std::make_shared<GlassMaterial>();
      case TYPE_PLASTIC_MATERIAL:
        return std::make_shared<PlasticMaterial>();
      case TYPE_MIRROR_MATERIAL:
        return std::make_shared<MirrorMaterial>();
      case TYPE_SUBSTRATE_MATERIAL:
        return std::make_shared<SubstrateMaterial>();
      case TYPE_SUBSURFACE_MATERIAL:
        return std::make_shared<SubSurfaceMaterial>();
      case TYPE_MATTE_MATERIAL:
        return std::make_shared<MatteMaterial>();
      case TYPE_FOURIER_MATERIAL:
        return std::make_shared<FourierMaterial>();
      case TYPE_METAL_MATERIAL:
        return std::make_shared<MetalMaterial>();
      case TYPE_HAIR_MATERIAL:
        return std::make_shared<HairMaterial>();
      case TYPE_FILM:
        return std::make_shared<Film>(vec2i(0));
      case TYPE_CAMERA:
        return std::make_shared<Camera>();
      case TYPE_TRIANGLE_MESH:
        return std::make_shared<TriangleMesh>();
      case TYPE_QUAD_MESH:
        return std::make_shared<QuadMesh>();
      case TYPE_SPHERE:
        return std::make_shared<Sphere>();
      case TYPE_DISK:
        return std::make_shared<Disk>();
      case TYPE_CURVE:
        return std::make_shared<Curve>();
      case TYPE_INSTANCE:
        return std::make_shared<Instance>();
      case TYPE_OBJECT:
        return std::make_shared<Object>();
      case TYPE_DIFFUSE_AREALIGHT_BB:
        return std::make_shared<DiffuseAreaLightBB>();
      case TYPE_DIFFUSE_AREALIGHT_RGB:
        return std::make_shared<DiffuseAreaLightRGB>();
      case TYPE_INFINITE_LIGHT_SOURCE:
        return std::make_shared<InfiniteLightSource>();
      case TYPE_DISTANT_LIGHT_SOURCE:
        return std::make_shared<DistantLightSource>();
      case TYPE_SPOT_LIGHT_SOURCE:
        return std::make_shared<SpotLightSource>();
      case TYPE_POINT_LIGHT_SOURCE:
        return std::make_shared<PointLightSource>();
      case TYPE_SPECTRUM:
        return std::make_shared<Spectrum>();
      case TYPE_SAMPLER:
        return std::make_shared<Sampler>();
      case TYPE_INTEGRATOR:
        return std::make_shared<Integrator>();
      case TYPE_PIXEL_FILTER:
        return std::make_shared<PixelFilter>();
      default:
        std::cerr << "unknown entity type tag " << typeTag << " in binary file" << std::endl;
        return Entity::SP();
      };
    }